

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlGetPropNodeValueInternal(xmlAttr *prop)

{
  xmlChar *pxVar1;
  xmlChar *ret;
  xmlAttr *prop_local;
  
  if (prop == (xmlAttr *)0x0) {
    prop_local = (xmlAttr *)0x0;
  }
  else if (prop->type == XML_ATTRIBUTE_NODE) {
    if (prop->children != (_xmlNode *)0x0) {
      if ((prop->children->next == (_xmlNode *)0x0) &&
         ((prop->children->type == XML_TEXT_NODE || (prop->children->type == XML_CDATA_SECTION_NODE)
          ))) {
        pxVar1 = xmlStrdup(prop->children->content);
        return pxVar1;
      }
      pxVar1 = xmlNodeListGetString(prop->doc,prop->children,1);
      if (pxVar1 != (xmlChar *)0x0) {
        return pxVar1;
      }
    }
    prop_local = (xmlAttr *)xmlStrdup("");
  }
  else if (prop->type == XML_ATTRIBUTE_DECL) {
    prop_local = (xmlAttr *)xmlStrdup((xmlChar *)prop->psvi);
  }
  else {
    prop_local = (xmlAttr *)0x0;
  }
  return (xmlChar *)prop_local;
}

Assistant:

static xmlChar*
xmlGetPropNodeValueInternal(const xmlAttr *prop)
{
    if (prop == NULL)
	return(NULL);
    if (prop->type == XML_ATTRIBUTE_NODE) {
	/*
	* Note that we return at least the empty string.
	*   TODO: Do we really always want that?
	*/
	if (prop->children != NULL) {
	    if ((prop->children->next == NULL) &&
		((prop->children->type == XML_TEXT_NODE) ||
		(prop->children->type == XML_CDATA_SECTION_NODE)))
	    {
		/*
		* Optimization for the common case: only 1 text node.
		*/
		return(xmlStrdup(prop->children->content));
	    } else {
		xmlChar *ret;

		ret = xmlNodeListGetString(prop->doc, prop->children, 1);
		if (ret != NULL)
		    return(ret);
	    }
	}
	return(xmlStrdup((xmlChar *)""));
    } else if (prop->type == XML_ATTRIBUTE_DECL) {
	return(xmlStrdup(((xmlAttributePtr)prop)->defaultValue));
    }
    return(NULL);
}